

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O3

void lys_compile_mandatory_parents(lysc_node *parent,ly_bool add)

{
  lysc_node *plVar1;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,add) == 0) {
    for (; ((parent != (lysc_node *)0x0 && (parent->nodetype == 1)) && ((parent->flags & 0x20) != 0)
           ); parent = parent->parent) {
      for (plVar1 = lysc_node_child(parent); plVar1 != (lysc_node *)0x0; plVar1 = plVar1->next) {
        if ((plVar1->flags & 0x20) != 0) {
          return;
        }
      }
      *(byte *)&parent->flags = (byte)parent->flags & 0xdf;
    }
  }
  else {
    for (; ((parent != (lysc_node *)0x0 && (parent->nodetype == 1)) && ((parent->flags & 0xa0) == 0)
           ); parent = parent->parent) {
      parent->flags = parent->flags | 0x20;
    }
  }
  return;
}

Assistant:

void
lys_compile_mandatory_parents(struct lysc_node *parent, ly_bool add)
{
    const struct lysc_node *iter;

    if (add) { /* set flag */
        for ( ; parent && parent->nodetype == LYS_CONTAINER && !(parent->flags & LYS_MAND_TRUE) && !(parent->flags & LYS_PRESENCE);
                parent = parent->parent) {
            parent->flags |= LYS_MAND_TRUE;
        }
    } else { /* unset flag */
        for ( ; parent && parent->nodetype == LYS_CONTAINER && (parent->flags & LYS_MAND_TRUE); parent = parent->parent) {
            for (iter = lysc_node_child(parent); iter; iter = iter->next) {
                if (iter->flags & LYS_MAND_TRUE) {
                    /* there is another mandatory node */
                    return;
                }
            }
            /* unset mandatory flag - there is no mandatory children in the non-presence container */
            parent->flags &= ~LYS_MAND_TRUE;
        }
    }
}